

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O3

void __thiscall QToolBarAreaLayoutLine::fitLayout(QToolBarAreaLayoutLine *this)

{
  QToolBarAreaLayoutItem *this_00;
  Orientation OVar1;
  ulong uVar2;
  long *plVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  QSize QVar7;
  pointer pQVar8;
  undefined4 extraout_var;
  QToolBarLayout *this_01;
  QSize QVar9;
  Representation RVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  uint local_44;
  
  OVar1 = this->o;
  QVar7 = minimumSize(this);
  if ((this->toolBarItems).d.size != 0) {
    iVar5 = (this->rect).y2.m_i - (this->rect).y1.m_i;
    if (this->o == Horizontal) {
      iVar5 = (this->rect).x2.m_i - (this->rect).x1.m_i;
    }
    RVar10 = QVar7.ht.m_i;
    if (OVar1 == Horizontal) {
      RVar10 = QVar7.wd.m_i;
    }
    uVar11 = (iVar5 - RVar10.m_i) + 1;
    uVar15 = 0;
    uVar12 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar12 = uVar15;
    }
    local_44 = 0xffffffff;
    uVar14 = 0;
    do {
      pQVar8 = QList<QToolBarAreaLayoutItem>::data(&this->toolBarItems);
      this_00 = (QToolBarAreaLayoutItem *)((long)&pQVar8->widgetItem + uVar15);
      if ((&pQVar8->gap)[uVar15] == false) {
        if (this_00->widgetItem != (QLayoutItem *)0x0) {
          iVar5 = (*this_00->widgetItem->_vptr_QLayoutItem[8])();
          if ((char)iVar5 == '\0') goto LAB_004af5c2;
        }
      }
      else {
LAB_004af5c2:
        iVar6 = (int)uVar12;
        iVar5 = (*this_00->widgetItem->_vptr_QLayoutItem[0xd])();
        QWidget::layout((QWidget *)CONCAT44(extraout_var,iVar5));
        this_01 = (QToolBarLayout *)QMetaObject::cast((QObject *)&QToolBarLayout::staticMetaObject);
        if (this_01 != (QToolBarLayout *)0x0) {
          QToolBarLayout::checkUsePopupMenu(this_01);
        }
        OVar1 = this->o;
        QVar9 = QToolBarAreaLayoutItem::minimumSize(this_00);
        QVar7 = (QSize)((ulong)QVar9 >> 0x20);
        if (OVar1 == Horizontal) {
          QVar7 = QVar9;
        }
        RVar10.m_i = *(int *)((long)&pQVar8->preferredSize + uVar15);
        if (RVar10.m_i < 1) {
          OVar1 = this->o;
          QVar9 = QToolBarAreaLayoutItem::sizeHint(this_00);
          RVar10.m_i = QVar9.ht.m_i.m_i;
          if (OVar1 == Horizontal) {
            RVar10.m_i = QVar9.wd.m_i.m_i;
          }
        }
        iVar5 = RVar10.m_i - QVar7.wd.m_i;
        if (iVar6 <= iVar5) {
          iVar5 = iVar6;
        }
        *(int *)((long)&pQVar8->size + uVar15) = QVar7.wd.m_i.m_i + iVar5;
        uVar12 = (ulong)(uint)(iVar6 - iVar5);
        local_44 = (uint)uVar14;
      }
      uVar14 = uVar14 + 1;
      uVar2 = (this->toolBarItems).d.size;
      uVar15 = uVar15 + 0x18;
    } while (uVar14 < uVar2);
    if (uVar2 != 0) {
      lVar13 = 0x14;
      uVar12 = 0;
      iVar5 = 0;
      do {
        pQVar8 = QList<QToolBarAreaLayoutItem>::data(&this->toolBarItems);
        if (*(char *)((long)&pQVar8->widgetItem + lVar13) == '\0') {
          plVar3 = *(long **)((long)pQVar8 + lVar13 + -0x14);
          if (plVar3 != (long *)0x0) {
            cVar4 = (**(code **)(*plVar3 + 0x40))();
            if (cVar4 == '\0') goto LAB_004af6ad;
          }
        }
        else {
LAB_004af6ad:
          *(int *)((long)pQVar8 + lVar13 + -0xc) = iVar5;
          if (local_44 == uVar12) {
            iVar6 = (this->rect).y2.m_i - (this->rect).y1.m_i;
            if (this->o == Horizontal) {
              iVar6 = (this->rect).x2.m_i - (this->rect).x1.m_i;
            }
            iVar6 = (iVar6 - iVar5) + 1;
            if (iVar6 < 1) {
              iVar6 = 0;
            }
            *(int *)((long)pQVar8 + lVar13 + -8) = iVar6;
          }
          else {
            iVar6 = *(int *)((long)pQVar8 + lVar13 + -8);
          }
          iVar5 = iVar5 + iVar6;
        }
        uVar12 = uVar12 + 1;
        lVar13 = lVar13 + 0x18;
      } while (uVar12 < (ulong)(this->toolBarItems).d.size);
    }
  }
  return;
}

Assistant:

void QToolBarAreaLayoutLine::fitLayout()
{
    int last = -1;
    int min = pick(o, minimumSize());
    int space = pick(o, rect.size());
    int extra = qMax(0, space - min);

    for (int i = 0; i < toolBarItems.size(); ++i) {
        QToolBarAreaLayoutItem &item = toolBarItems[i];
        if (item.skip())
            continue;

        if (QToolBarLayout *tblayout = qobject_cast<QToolBarLayout*>(item.widgetItem->widget()->layout()))
            tblayout->checkUsePopupMenu();

        const int itemMin = pick(o, item.minimumSize());
        //preferredSize is the default if it is set, otherwise, we take the sizehint
        item.size = item.preferredSize > 0 ? item.preferredSize : pick(o, item.sizeHint());

        //the extraspace is the space above the item minimum sizehint
        const int extraSpace = qMin(item.size - itemMin, extra);
        item.size = itemMin + extraSpace; //that is the real size

        extra -= extraSpace;

        last = i;
    }

    // calculate the positions from the sizes
    int pos = 0;
    for (int i = 0; i < toolBarItems.size(); ++i) {
        QToolBarAreaLayoutItem &item = toolBarItems[i];
        if (item.skip())
            continue;

        item.pos = pos;
        if (i == last) // stretch the last item to the end of the line
            item.size = qMax(0, pick(o, rect.size()) - item.pos);
        pos += item.size;
    }
}